

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O1

string * StrFormatInternalBug_abi_cxx11_
                   (string *__return_storage_ptr__,string_view msg,string_view file,int line,
                   string_view func)

{
  long in_FS_OFFSET;
  char (*args_6) [42];
  int line_local;
  string_view file_local;
  string_view msg_local;
  long *local_50 [2];
  long local_40 [2];
  long local_30;
  
  file_local._M_str = file._M_str;
  file_local._M_len = file._M_len;
  msg_local._M_str = msg._M_str;
  msg_local._M_len = msg._M_len;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  args_6 = (char (*) [42])0x7423e4;
  line_local = line;
  FormatFullVersion_abi_cxx11_();
  tinyformat::
  format<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,char[13],std::__cxx11::string,char[42]>
            (__return_storage_ptr__,
             (tinyformat *)
             "Internal bug detected: %s\n%s:%d (%s)\n%s %s\nPlease report this issue here: %s\n",
             (char *)&msg_local,&file_local,
             (basic_string_view<char,_std::char_traits<char>_> *)&line_local,(int *)&func,
             (basic_string_view<char,_std::char_traits<char>_> *)"Bitcoin Core",
             (char (*) [13])local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "https://github.com/bitcoin/bitcoin/issues",args_6);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string StrFormatInternalBug(std::string_view msg, std::string_view file, int line, std::string_view func)
{
    return strprintf("Internal bug detected: %s\n%s:%d (%s)\n"
                     "%s %s\n"
                     "Please report this issue here: %s\n",
                     msg, file, line, func, PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
}